

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.h
# Opt level: O2

void __thiscall
jrtplib::RTPUDPv6TransmissionInfo::~RTPUDPv6TransmissionInfo(RTPUDPv6TransmissionInfo *this)

{
  ~RTPUDPv6TransmissionInfo(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

~RTPUDPv6TransmissionInfo()								{ }